

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_ConvertToConfidentialValue_Test::TestBody
          (ConfidentialValue_ConvertToConfidentialValue_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90 [3];
  string local_78 [32];
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  ByteData bytedata;
  Amount amount;
  ConfidentialValue_ConvertToConfidentialValue_Test *this_local;
  
  cfd::core::Amount::CreateBySatoshiAmount(100000000);
  cfd::core::ConfidentialValue::ConvertToConfidentialValue((Amount *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_58,"bytedata.GetHex().c_str()","\"010000000005f5e100\"",pcVar2,
             "010000000005f5e100");
  std::__cxx11::string::~string(local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ConfidentialValue, ConvertToConfidentialValue) {
  Amount amount = Amount::CreateBySatoshiAmount(100000000);
  ByteData bytedata = ConfidentialValue::ConvertToConfidentialValue(amount);
  EXPECT_STREQ(bytedata.GetHex().c_str(), "010000000005f5e100");
}